

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubstHelper.hpp
# Opt level: O3

FormulaList *
Kernel::SubstHelper::
applyImpl<false,Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::GenMatcher::Applicator>
          (FormulaList *fs,Applicator *applicator,bool noSharing)

{
  Formula *f;
  FormulaList *pFVar1;
  List<Kernel::Formula_*> **ppLVar2;
  Formula *pFVar3;
  FormulaList *pFVar4;
  ulong uVar5;
  FormulaList *pFVar6;
  Stack<Lib::List<Kernel::Formula_*>_*> local_68;
  FixedSizeAllocator<16UL> *local_40;
  Applicator *local_38;
  
  if (fs == (FormulaList *)0x0) {
    pFVar4 = (FormulaList *)0x0;
  }
  else {
    local_68._cursor = (List<Kernel::Formula_*> **)0x0;
    local_68._end = (List<Kernel::Formula_*> **)0x0;
    local_68._capacity = 0;
    local_68._stack = (List<Kernel::Formula_*> **)0x0;
    ppLVar2 = local_68._cursor;
    local_38 = applicator;
    do {
      local_68._cursor = ppLVar2;
      if (local_68._cursor == local_68._end) {
        Lib::Stack<Lib::List<Kernel::Formula_*>_*>::expand(&local_68);
      }
      *local_68._cursor = fs;
      ppLVar2 = local_68._cursor + 1;
      fs = fs->_tail;
    } while (fs != (List<Kernel::Formula_*> *)0x0);
    pFVar4 = (*local_68._cursor)->_tail;
    local_68._cursor = ppLVar2;
    if (ppLVar2 != local_68._stack) {
      local_40 = (FixedSizeAllocator<16UL> *)(Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x18);
      pFVar6 = pFVar4;
      do {
        pFVar4 = local_68._cursor[-1];
        f = pFVar4->_head;
        pFVar1 = pFVar4->_tail;
        local_68._cursor = local_68._cursor + -1;
        pFVar3 = applyImpl<false,Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::GenMatcher::Applicator>
                           (f,local_38,noSharing);
        if (f != pFVar3 || pFVar1 != pFVar6) {
          pFVar4 = (FormulaList *)Lib::FixedSizeAllocator<16UL>::alloc(local_40);
          pFVar4->_head = pFVar3;
          pFVar4->_tail = pFVar6;
        }
        pFVar6 = pFVar4;
      } while (local_68._cursor != local_68._stack);
    }
    if (local_68._stack != (List<Kernel::Formula_*> **)0x0) {
      uVar5 = local_68._capacity * 8 + 0xf & 0xfffffffffffffff0;
      if (uVar5 == 0) {
        *local_68._stack = (List<Kernel::Formula_*> *)Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
        Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = local_68._stack;
      }
      else if (uVar5 < 0x11) {
        *local_68._stack = (List<Kernel::Formula_*> *)Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_;
        Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_ = local_68._stack;
      }
      else if (uVar5 < 0x19) {
        *local_68._stack = (List<Kernel::Formula_*> *)Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_;
        Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_ = local_68._stack;
      }
      else if (uVar5 < 0x21) {
        *local_68._stack = (List<Kernel::Formula_*> *)Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_;
        Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_ = local_68._stack;
      }
      else if (uVar5 < 0x31) {
        *local_68._stack = (List<Kernel::Formula_*> *)Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_;
        Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_ = local_68._stack;
      }
      else if (uVar5 < 0x41) {
        *local_68._stack = (List<Kernel::Formula_*> *)Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_;
        Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_ = local_68._stack;
      }
      else {
        operator_delete(local_68._stack,0x10);
      }
    }
  }
  return pFVar4;
}

Assistant:

FormulaList* SubstHelper::applyImpl(FormulaList* fs, Applicator& applicator, bool noSharing)
{
  if (FormulaList::isEmpty(fs)) {
    return fs;
  }

  Stack<FormulaList*> args;
  while (FormulaList::isNonEmpty(fs)) {
    args.push(fs);
    fs = fs->tail();
  }

  FormulaList* res = args.top()->tail();
  ASS(FormulaList::isEmpty(res));

  while (args.isNonEmpty()) {
    fs = args.pop();
    Formula* g = fs->head();
    FormulaList* gs = fs->tail();
    Formula* h = applyImpl<ProcessSpecVars>(g, applicator, noSharing);
    FormulaList* hs = res; // = applyImpl<ProcessSpecVars>(gs, applicator, noSharing);

    if (gs == hs && g == h) {
      res = fs;
    } else {
      res = new FormulaList(h,hs);
    }
  }

  return res;
}